

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateScaleFactorsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          ,int partitionIndex)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  ulong uVar5;
  int j;
  long lVar6;
  float fVar7;
  double dVar8;
  
  if ((this->kFlags & 0x80) == 0) {
    iVar4 = this->gPatternPartitionsStartPatterns[partitionIndex];
    iVar1 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
    pfVar2 = this->gScaleBuffers[cumulativeScalingIndex];
    for (uVar5 = 0; uVar5 != (uint)(~(count >> 0x1f) & count); uVar5 = uVar5 + 1) {
      pfVar3 = this->gScaleBuffers[scalingIndices[uVar5]];
      for (lVar6 = (long)iVar4; lVar6 < iVar1; lVar6 = lVar6 + 1) {
        if ((this->kFlags & 0x400) == 0) {
          dVar8 = log((double)pfVar3[lVar6]);
          fVar7 = (float)(dVar8 + (double)pfVar2[lVar6]);
        }
        else {
          fVar7 = pfVar3[lVar6] + pfVar2[lVar6];
        }
        pfVar2[lVar6] = fVar7;
      }
    }
    iVar4 = 0;
  }
  else {
    iVar4 = -7;
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactorsByPartition(const int* scalingIndices,
                                                                         int count,
                                                                         int cumulativeScalingIndex,
                                                                         int partitionIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    } else {

        int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
        int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=startPattern; j<endPattern; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

    }

    return BEAGLE_SUCCESS;
}